

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableI2cAnalyzer.cpp
# Opt level: O1

void __thiscall EnrichableI2cAnalyzer::GetByte(EnrichableI2cAnalyzer *this)

{
  pointer puVar1;
  iterator __position;
  EnrichableAnalyzerSubprocess *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  U64 UVar5;
  U64 packetId;
  uint uVar6;
  Channel *pCVar7;
  Channel *pCVar8;
  Marker *marker;
  pointer pMVar9;
  ulong uVar10;
  U32 sampleCount;
  ulong uVar11;
  bool bVar12;
  DataBuilder byte;
  BitState ack_bit_state;
  U64 scl_rising_edge_1;
  U64 potential_ending_sample;
  BitState bit_state;
  U64 value;
  U64 scl_rising_edge;
  DataBuilder aDStack_a8 [12];
  BitState local_9c;
  unsigned_long_long local_98;
  unsigned_long_long local_90;
  U64 local_88;
  ulong local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined1 local_6f;
  U64 local_68;
  vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
  local_60;
  vector<unsigned_long_long,std::allocator<unsigned_long_long>> *local_48;
  byte local_40 [8];
  U64 local_38;
  
  puVar1 = (this->mArrowLocataions).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mArrowLocataions).
      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->mArrowLocataions).
    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  DataBuilder::DataBuilder(aDStack_a8);
  uVar6 = 0;
  DataBuilder::Reset((ulonglong *)aDStack_a8,(ShiftOrder)local_40,0);
  local_48 = (vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
             &this->mArrowLocataions;
  local_68 = 0;
  bVar12 = false;
  local_98 = 0;
  do {
    bVar2 = GetBitPartOne(this,(BitState *)&local_60,&local_90,&local_68);
    bVar3 = GetBitPartTwo(this);
    if (bVar2 && bVar3) {
      __position._M_current =
           (this->mArrowLocataions).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mArrowLocataions).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
        _M_realloc_insert<unsigned_long_long_const&>(local_48,__position,&local_90);
      }
      else {
        *__position._M_current = local_90;
        (this->mArrowLocataions).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      DataBuilder::AddBit((BitState)aDStack_a8);
      if (uVar6 == 0) {
        local_98 = local_90;
      }
    }
    if (!bVar2 || !bVar3) break;
    bVar12 = 6 < uVar6;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 8);
  if (bVar12) {
    UVar5 = AnalyzerChannelData::GetSampleNumber();
    bVar12 = GetBitPartOne(this,&local_9c,&local_38,&local_68);
    Frame::Frame((Frame *)&local_90);
    local_90 = local_98;
    local_88 = UVar5;
    if (bVar12) {
      local_88 = local_68;
    }
    local_80 = (ulong)local_40[0];
    local_78 = 0;
    if (!bVar12) {
      local_6f = 2;
    }
    else if (local_9c == BIT_HIGH) {
      local_6f = 0x40;
    }
    else {
      local_6f = 1;
    }
    local_70 = (bVar12 & this->mNeedAddress) != 1;
    if (!(bool)local_70) {
      this->mNeedAddress = false;
    }
    UVar5 = AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    uVar11 = (ulong)((long)(this->mArrowLocataions).
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mArrowLocataions).
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    sampleCount = (U32)uVar11;
    if (sampleCount != 0) {
      uVar10 = 0;
      do {
        AnalyzerResults::AddMarker
                  ((ulonglong)(this->mResults)._M_ptr,
                   (MarkerType)
                   (this->mArrowLocataions).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10],(Channel *)0x4);
        uVar10 = uVar10 + 1;
      } while ((uVar11 & 0xffffffff) != uVar10);
    }
    bVar12 = EnrichableAnalyzerSubprocess::MarkerEnabled((this->mSubprocess)._M_ptr);
    if (bVar12) {
      this_00 = (this->mSubprocess)._M_ptr;
      packetId = AnalyzerResults::GetNumPackets();
      EnrichableAnalyzerSubprocess::EmitMarker
                (&local_60,this_00,packetId,UVar5,(Frame *)&local_90,sampleCount);
      if (local_60.
          super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_60.
          super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pCVar7 = (Channel *)0x0;
        pMVar9 = local_60.
                 super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar4 = std::__cxx11::string::compare((char *)&pMVar9->channelName);
          pCVar8 = &((this->mSettings)._M_ptr)->mSdaChannel;
          if (iVar4 != 0) {
            pCVar8 = pCVar7;
          }
          if (pCVar8 == (Channel *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Received marker request for invalid marker: ",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,(pMVar9->channelName)._M_dataplus._M_p,
                       (pMVar9->channelName)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," ignoring.\n",0xb);
          }
          else {
            AnalyzerResults::AddMarker
                      ((ulonglong)(this->mResults)._M_ptr,
                       (MarkerType)
                       (this->mArrowLocataions).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[pMVar9->sampleNumber],
                       (Channel *)(ulong)pMVar9->markerType);
          }
          pMVar9 = pMVar9 + 1;
          pCVar7 = pCVar8;
        } while (pMVar9 != local_60.
                           super__Vector_base<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<EnrichableAnalyzerSubprocess::Marker,_std::allocator<EnrichableAnalyzerSubprocess::Marker>_>
      ::~vector(&local_60);
    }
    AnalyzerResults::CommitResults();
    GetBitPartTwo(this);
    Frame::~Frame((Frame *)&local_90);
  }
  DataBuilder::~DataBuilder(aDStack_a8);
  return;
}

Assistant:

void EnrichableI2cAnalyzer::GetByte()
{
	mArrowLocataions.clear();
	U64 value;
	DataBuilder byte;
	byte.Reset( &value, AnalyzerEnums::MsbFirst, 8 );
	U64 starting_stample = 0;
	U64 potential_ending_sample = 0;
	
	for( U32 i=0; i<8; i++ )
	{
		BitState bit_state;
		U64 scl_rising_edge;
		bool result = GetBitPartOne( bit_state, scl_rising_edge, potential_ending_sample );
		result &= GetBitPartTwo();
		if( result == true )
		{
			mArrowLocataions.push_back( scl_rising_edge );
			byte.AddBit( bit_state );

			if( i == 0 )
				starting_stample = scl_rising_edge;
		}else
		{
			return;
		}
	}

	BitState ack_bit_state;
	U64 scl_rising_edge;
	S64 last_valid_sample = mScl->GetSampleNumber();
	bool result = GetBitPartOne( ack_bit_state, scl_rising_edge, potential_ending_sample );//GetBit( ack_bit_state, scl_rising_edge );
	
	Frame frame;
	frame.mStartingSampleInclusive = starting_stample;
	frame.mEndingSampleInclusive = result ? potential_ending_sample : last_valid_sample;
	frame.mData1 = U8( value );
	frame.mData2 = U8( 0 );

	if( !result )
		frame.mFlags = I2C_MISSING_FLAG_ACK;
	else if( ack_bit_state == BIT_HIGH )
		frame.mFlags = DISPLAY_AS_WARNING_FLAG;
	else
		frame.mFlags = I2C_FLAG_ACK;

	if( mNeedAddress == true && result == true ) //if result is false, then we have already recorded a stop bit and toggled mNeedAddress
	{
		mNeedAddress = false;
		frame.mType = I2cAddress;
	}else
	{
		frame.mType = I2cData;
	}
	U64 frameIndex = mResults->AddFrame( frame );

	U32 count = mArrowLocataions.size();
	for( U32 i=0; i<count; i++ )
		mResults->AddMarker( mArrowLocataions[i], AnalyzerResults::UpArrow, mSettings->mSclChannel );

	if(mSubprocess->MarkerEnabled()) {
		std::vector<EnrichableAnalyzerSubprocess::Marker> markers = mSubprocess->EmitMarker(
			mResults->GetNumPackets(),
			frameIndex,
			frame,
			count
		);

		Channel* channel = NULL;
		for(const EnrichableAnalyzerSubprocess::Marker& marker : markers) {
			if(marker.channelName == "sda") {
				channel = &mSettings->mSdaChannel;
			}
			if(channel != NULL) {
				mResults->AddMarker(
					mArrowLocataions[marker.sampleNumber],
					marker.markerType,
					*channel
				);
			} else {
				std::cerr << "Received marker request for invalid marker: ";
				std::cerr << marker.channelName;
				std::cerr << " ignoring.\n";
			}
		}
	}

	mResults->CommitResults();

	result &= GetBitPartTwo();
}